

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::append(QString *this,QChar ch)

{
  QArrayDataPointer<char16_t>::detachAndGrow
            (&this->d,GrowsAtEnd,1,(char16_t **)0x0,(QArrayDataPointer<char16_t> *)0x0);
  QtPrivate::QPodArrayOps<char16_t>::copyAppend((QPodArrayOps<char16_t> *)this,1,ch.ucs);
  (this->d).ptr[(this->d).size] = L'\0';
  return this;
}

Assistant:

QString &QString::append(QChar ch)
{
    d.detachAndGrow(QArrayData::GrowsAtEnd, 1, nullptr, nullptr);
    d->copyAppend(1, ch.unicode());
    d.data()[d.size] = '\0';
    return *this;
}